

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<unsigned_short,unsigned_char,12>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (unsigned_short *lhs,uchar *rhs,uchar *result)

{
  byte *in_RSI;
  ushort *in_RDI;
  unsigned_short tmp;
  uchar *in_stack_ffffffffffffffd8;
  
  if ((ushort)*in_RSI <= *in_RDI) {
    SafeCastHelper<unsigned_char,unsigned_short,2>::
    CastThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (*in_RDI - (ushort)*in_RSI,in_stack_ffffffffffffffd8);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, U& result ) SAFEINT_CPP_THROW
    {
        // both are unsigned - easy case
        if( rhs <= lhs )
        {
            T tmp = (T)(lhs - rhs);
            SafeCastHelper< U, T, GetCastMethod<U, T>::method >::template CastThrow<E>( tmp, result);
            return;
        }

        E::SafeIntOnOverflow();
    }